

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::getPartials
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,int cumulativeScaleIndex,
          double *outPartials)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int i;
  int iVar7;
  double *offsetOutPartials;
  double *pdVar8;
  int l;
  int iVar9;
  long lVar10;
  float *offsetBeaglePartials;
  float *pfVar11;
  double dVar12;
  
  iVar5 = -5;
  if ((-1 < bufferIndex) && (bufferIndex < *(int *)&(this->super_BeagleImpl).field_0xc)) {
    uVar1 = this->kStateCount;
    uVar6 = (ulong)uVar1;
    iVar5 = this->kPatternCount;
    uVar2 = this->kPartialsPaddedStateCount;
    uVar4 = (ulong)uVar2;
    if (uVar1 == uVar2 && this->kPaddedPatternCount == iVar5) {
      beagleMemCpy<double,float>(outPartials,this->gPartials[(uint)bufferIndex],this->kPartialsSize)
      ;
    }
    else {
      iVar9 = 0;
      pfVar11 = this->gPartials[(uint)bufferIndex];
      pdVar8 = outPartials;
      if (uVar1 == uVar2) {
        for (; iVar9 < this->kCategoryCount; iVar9 = iVar9 + 1) {
          beagleMemCpy<double,float>(pdVar8,pfVar11,(int)uVar4 * iVar5);
          uVar4 = (ulong)this->kStateCount;
          iVar5 = this->kPatternCount;
          pdVar8 = pdVar8 + this->kStateCount * iVar5;
          pfVar11 = pfVar11 + (long)this->kPaddedPatternCount * uVar4;
        }
      }
      else {
        for (; iVar9 < this->kCategoryCount; iVar9 = iVar9 + 1) {
          for (iVar7 = 0; iVar7 < iVar5; iVar7 = iVar7 + 1) {
            beagleMemCpy<double,float>(pdVar8,pfVar11,(uint)uVar6);
            uVar6 = (ulong)this->kStateCount;
            iVar5 = this->kPatternCount;
            pdVar8 = pdVar8 + uVar6;
            pfVar11 = pfVar11 + this->kPartialsPaddedStateCount;
          }
          pfVar11 = pfVar11 + (long)this->kPartialsPaddedStateCount *
                              ((long)this->kPaddedPatternCount - (long)iVar5);
        }
      }
    }
    if (cumulativeScaleIndex == -1) {
      iVar5 = 0;
    }
    else {
      iVar5 = 0;
      pfVar11 = this->gScaleBuffers[cumulativeScaleIndex];
      iVar9 = 0;
      for (lVar10 = 0; lVar10 < this->kPatternCount; lVar10 = lVar10 + 1) {
        dVar12 = exp((double)pfVar11[lVar10]);
        iVar7 = (~(this->kStateCount >> 0x1f) & this->kStateCount) + iVar9;
        for (lVar3 = (long)iVar9; iVar7 != lVar3; lVar3 = lVar3 + 1) {
          outPartials[lVar3] = (double)(float)dVar12 * outPartials[lVar3];
        }
        iVar9 = iVar7;
      }
    }
  }
  return iVar5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getPartials(int bufferIndex,
                               int cumulativeScaleIndex,
                               double* outPartials) {

    // TODO: Test with and without padding
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;

    if ((kPatternCount == kPaddedPatternCount) && (kStateCount == kPartialsPaddedStateCount)) {
        beagleMemCpy(outPartials, gPartials[bufferIndex], kPartialsSize);
    } else if (kStateCount == kPartialsPaddedStateCount) {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kPatternCount * kStateCount);
            offsetOutPartials += kPatternCount * kStateCount;
            offsetBeaglePartials += kPaddedPatternCount * kStateCount;
        }
    } else {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kStateCount);
                offsetOutPartials += kStateCount;
                offsetBeaglePartials += kPartialsPaddedStateCount;
            }
            offsetBeaglePartials += (kPaddedPatternCount - kPatternCount) * kPartialsPaddedStateCount;
        }
    }

    if (cumulativeScaleIndex != BEAGLE_OP_NONE) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
        int index = 0;
        for(int k=0; k<kPatternCount; k++) {
            REALTYPE scaleFactor = exp(cumulativeScaleBuffer[k]);
            for(int i=0; i<kStateCount; i++) {
                outPartials[index] *= scaleFactor;
                index++;
            }
        }
        // TODO: Do we assume the cumulativeScaleBuffer is on the log-scale?
    }

    return BEAGLE_SUCCESS;
}